

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_value(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
             *this,json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  string_type *buffer;
  uint8_t *puVar2;
  char *first;
  uchar *puVar3;
  pointer pcVar4;
  int iVar5;
  bson_errc __e;
  byte bVar6;
  long lVar7;
  size_t sVar8;
  pointer puVar9;
  _func_int **pp_Var10;
  uint8_t *puVar11;
  type_conflict4 *ptVar12;
  undefined7 in_register_00000011;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer puVar16;
  ulong uVar17;
  type tVar18;
  decimal128_to_chars_result dVar19;
  undefined8 uStack_c0;
  uint8_t buf [8];
  uint8_t buf_4 [4];
  uint8_t uStack_a4;
  uint8_t uStack_a3;
  uint8_t uStack_a2;
  uint8_t uStack_a1;
  ulong uStack_a0;
  type_conflict4 length;
  undefined4 uStack_7c;
  pointer local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  parse_mode local_34;
  
  puVar11 = buf;
  ptVar12 = (type_conflict4 *)buf;
  iVar5 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar5) {
  case 1:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 8);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 8) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_0016767b:
      bVar6 = this->cursor_mode_ ^ 1;
      goto LAB_00167680;
    }
    break;
  case 2:
  case 0xe:
    goto switchD_00166dda_caseD_2;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
                (long)&(this->options_)._vptr_bson_decode_options) <
        (int)(((long)(this->state_stack_).
                     super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->state_stack_).
                    super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      __e = max_nesting_depth_exceeded;
      goto LAB_00166ebf;
    }
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    do {
      if (puVar11 == puVar2) break;
      buf_4[(long)buf] = *puVar11;
      buf = (uint8_t  [8])((long)buf + 1);
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (buf != (uint8_t  [8])0x4);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + (long)buf;
    if (buf == (uint8_t  [8])0x4) {
      _length = CONCAT44(uStack_7c,buf_4);
      (*visitor->_vptr_basic_json_visitor[6])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if (ec->_M_value != 0) {
        return;
      }
      local_34 = array;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_34,&length,(unsigned_long *)buf);
      return;
    }
LAB_001676a4:
    __e = unexpected_eof;
    goto LAB_00166ebf;
  case 5:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf_4[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 4);
    sVar8 = (this->source_).position_ + lVar7;
    (this->source_).position_ = sVar8;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 != 4) goto LAB_001676a4;
    uVar15 = (ulong)(int)buf_4;
    if ((long)uVar15 < 0) {
      __e = length_is_negative;
      goto LAB_00166ebf;
    }
    puVar11 = (this->source_).current_.p_;
    ptVar12 = &length;
    if (puVar11 != (this->source_).end_.p_) {
      ptVar12 = (type_conflict4 *)((long)&length + 1);
      _length = CONCAT71(stack0xffffffffffffff81,*puVar11);
      (this->source_).current_.p_ = puVar11 + 1;
    }
    lVar7 = (long)ptVar12 - (long)&length;
    (this->source_).position_ = sVar8 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 1) {
      puVar16 = (this->bytes_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar16) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar16;
      }
      uVar14 = uVar15;
      if (buf_4 != (uint8_t  [4])0x0) {
        uVar17 = 0x4000;
        if (uVar15 < 0x4000) {
          uVar17 = uVar15;
        }
        do {
          if ((this->source_).current_.p_ == (this->source_).end_.p_) break;
          puVar16 = (this->bytes_buffer_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          puVar9 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&this->bytes_buffer_,(size_type)(puVar16 + (uVar17 - (long)puVar9)));
          puVar16 = puVar16 + ((long)(this->bytes_buffer_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)puVar9);
          puVar9 = puVar16;
          if (uVar17 != 0) {
            do {
              puVar3 = (this->source_).current_.p_;
              if (puVar3 == (this->source_).end_.p_) break;
              *puVar9 = *puVar3;
              puVar9 = puVar9 + 1;
              (this->source_).current_.p_ = (this->source_).current_.p_ + 1;
            } while (puVar9 < puVar16 + uVar17);
          }
          psVar1 = &(this->source_).position_;
          *psVar1 = *psVar1 + ((long)puVar9 - (long)puVar16);
          uVar14 = uVar14 - ((long)puVar9 - (long)puVar16);
          uVar17 = 0x4000;
          if (uVar14 < 0x4000) {
            uVar17 = uVar14;
          }
        } while (uVar14 != 0);
      }
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = *psVar1 + (uVar15 - uVar14);
      if (uVar14 == 0) {
        buf = (uint8_t  [8])
              (this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
        (*visitor->_vptr_basic_json_visitor[0xe])(visitor,buf,_length & 0xff,this,ec);
        goto LAB_0016767b;
      }
    }
    break;
  case 6:
    pp_Var10 = visitor->_vptr_basic_json_visitor;
    uVar13 = 0xd;
    goto LAB_001675aa;
  case 7:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf_4[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 0xc);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 0xc) {
      local_70 = (ulong)_buf_4 >> 0x20 & 0xff;
      local_68 = (ulong)_buf_4 >> 0x28 & 0xff;
      local_60 = (ulong)_buf_4 >> 0x30 & 0xff;
      local_58 = (ulong)_buf_4 >> 0x38;
      local_50 = uStack_a0 & 0xff;
      local_48 = uStack_a0 >> 8 & 0xff;
      local_40 = uStack_a0 >> 0x10 & 0xff;
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'\x18');
      pcVar4 = (this->text_buffer_)._M_dataplus._M_p;
      *(undefined2 *)pcVar4 =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            ((ulong)_buf_4 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 2) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            ((ulong)_buf_4 >> 8 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 4) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            ((ulong)_buf_4 >> 0x10 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 6) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            ((ulong)_buf_4 >> 0x18 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 8) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_70 * 2);
      *(undefined2 *)(pcVar4 + 10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_68 * 2);
      *(undefined2 *)(pcVar4 + 0xc) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_60 * 2);
      *(undefined2 *)(pcVar4 + 0xe) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_58 * 2);
      *(undefined2 *)(pcVar4 + 0x10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_50 * 2);
      *(undefined2 *)(pcVar4 + 0x12) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_48 * 2);
      *(undefined2 *)(pcVar4 + 0x14) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_40 * 2);
      *(undefined2 *)(pcVar4 + 0x16) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_a0 >> 0x18 & 0xff) * 2);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      (*visitor->_vptr_basic_json_visitor[0xc])(visitor,buf,0x13,this,ec);
      goto LAB_0016767b;
    }
    break;
  case 8:
    puVar2 = (this->source_).current_.p_;
    if (puVar2 != (this->source_).end_.p_) {
      puVar11 = buf + 1;
      buf[0] = *puVar2;
      (this->source_).current_.p_ = puVar2 + 1;
    }
    lVar7 = (long)puVar11 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 1) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_0016767b;
    }
    break;
  case 9:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 8);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 8) {
      pp_Var10 = visitor->_vptr_basic_json_visitor;
      uVar13 = 6;
LAB_00167614:
      (*pp_Var10[0x10])(visitor,buf,uVar13,this,ec);
      goto LAB_0016767b;
    }
    break;
  case 10:
    pp_Var10 = visitor->_vptr_basic_json_visitor;
    uVar13 = 0;
LAB_001675aa:
    (*pp_Var10[10])(visitor,uVar13,this,ec);
    goto LAB_001675b3;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var10 = visitor->_vptr_basic_json_visitor;
    uStack_c0 = 0x14;
    goto LAB_00167138;
  case 0xc:
  case 0xf:
switchD_00166dda_caseD_c:
    __e = unknown_type;
    goto LAB_00166ebf;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar18 = unicode_traits::validate<char>
                       ((this->text_buffer_)._M_dataplus._M_p,(this->text_buffer_)._M_string_length)
    ;
    if (tVar18.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var10 = visitor->_vptr_basic_json_visitor;
      uStack_c0 = 0x15;
      ptVar12 = (type_conflict4 *)buf;
      goto LAB_00167138;
    }
    goto LAB_0016769d;
  case 0x10:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 4);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 4) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_0016760c:
      pp_Var10 = visitor->_vptr_basic_json_visitor;
      uVar13 = 0;
      goto LAB_00167614;
    }
    break;
  case 0x11:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 8);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 8) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_0016767b;
    }
    break;
  case 0x12:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 8);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 == 8) goto LAB_0016760c;
    break;
  case 0x13:
    puVar11 = (this->source_).current_.p_;
    puVar2 = (this->source_).end_.p_;
    lVar7 = 0;
    do {
      if (puVar11 == puVar2) break;
      buf[lVar7] = *puVar11;
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 1;
      (this->source_).current_.p_ = puVar11;
    } while (lVar7 != 0x10);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar7;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar7;
    if (lVar7 != 0x10) goto LAB_001676a4;
    buf_4[0] = buf[0];
    buf_4[1] = buf[1];
    buf_4[2] = buf[2];
    buf_4[3] = buf[3];
    uStack_a4 = buf[4];
    uStack_a3 = buf[5];
    uStack_a2 = buf[6];
    uStack_a1 = buf[7];
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::resize((ulong)&this->text_buffer_,'*');
    first = (this->text_buffer_)._M_dataplus._M_p;
    dVar19 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                 (decimal128_t *)buf_4);
    local_78 = (this->text_buffer_)._M_dataplus._M_p;
    _length = (long)dVar19.ptr - (long)local_78;
    pp_Var10 = visitor->_vptr_basic_json_visitor;
    uStack_c0 = 0xb;
    ptVar12 = &length;
    goto LAB_00167138;
  default:
    if ((iVar5 != 0x7f) && (iVar5 != 0xff)) goto switchD_00166dda_caseD_c;
    goto switchD_00166dda_caseD_2;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar6 = false;
LAB_00167680:
  this->more_ = (bool)bVar6;
  return;
switchD_00166dda_caseD_2:
  (this->text_buffer_)._M_string_length = 0;
  *(this->text_buffer_)._M_dataplus._M_p = '\0';
  read_string(this,&this->text_buffer_,ec);
  if (ec->_M_value != 0) {
    return;
  }
  tVar18 = unicode_traits::validate<char>
                     ((this->text_buffer_)._M_dataplus._M_p,(this->text_buffer_)._M_string_length);
  if (tVar18.ec != success) {
LAB_0016769d:
    __e = invalid_utf8_text_string;
LAB_00166ebf:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    return;
  }
  buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
  pp_Var10 = visitor->_vptr_basic_json_visitor;
  uStack_c0 = 0;
  ptVar12 = (type_conflict4 *)buf;
LAB_00167138:
  (*pp_Var10[0xc])(visitor,ptVar12,uStack_c0,this,ec);
LAB_001675b3:
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }